

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallt_object(void *obj,char *name,metacall_value_id ret,void **args,size_t size)

{
  metacall_value_id mVar1;
  method pmVar2;
  object in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  method in_R8;
  method m;
  size_t iterator;
  type_id *ids;
  void *in_stack_ffffffffffffffa8;
  type_id *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  type_id ret_00;
  method in_stack_ffffffffffffffc0;
  object obj_00;
  value local_8;
  
  ret_00 = (type_id)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  obj_00 = (object)0x0;
  if (in_R8 != (method)0x0) {
    obj_00 = (object)malloc((long)in_R8 << 2);
    for (in_stack_ffffffffffffffc0 = (method)0x0;
        ret_00 = (type_id)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
        in_stack_ffffffffffffffc0 < in_R8;
        in_stack_ffffffffffffffc0 = (method)((long)&in_stack_ffffffffffffffc0->cls + 1)) {
      mVar1 = metacall_value_id(in_stack_ffffffffffffffa8);
      *(metacall_value_id *)((long)&obj_00->name + (long)in_stack_ffffffffffffffc0 * 4) = mVar1;
    }
  }
  pmVar2 = object_method(obj_00,(char *)in_stack_ffffffffffffffc0,ret_00,in_stack_ffffffffffffffb0,
                         (size_t)in_stack_ffffffffffffffa8);
  if (obj_00 != (object)0x0) {
    free(obj_00);
  }
  if (pmVar2 == (method)0x0) {
    log_write_impl_va("metacall",0x8d5,"metacallt_object",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                      ,LOG_LEVEL_ERROR,
                      "Method %s in object <%p> is not implemented with the parameter types being received"
                      ,in_RSI,in_RDI);
    local_8 = (value)0x0;
  }
  else {
    local_8 = object_call(in_RCX,in_R8,&obj_00->name,(size_t)in_stack_ffffffffffffffc0);
  }
  return local_8;
}

Assistant:

void *metacallt_object(void *obj, const char *name, const enum metacall_value_id ret, void *args[], size_t size)
{
	type_id *ids = NULL;

	if (size > 0)
	{
		ids = (type_id *)malloc(sizeof(type_id) * size);

		for (size_t iterator = 0; iterator < size; ++iterator)
		{
			ids[iterator] = metacall_value_id(args[iterator]);
		}
	}

	method m = object_method(obj, name, ret, ids, size);

	if (ids != NULL)
	{
		free(ids);
	}

	if (m == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Method %s in object <%p> is not implemented with the parameter types being received", name, obj);
		return NULL;
	}

	return object_call(obj, m, args, size);
}